

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O3

void __thiscall cmXMLWriter::cmXMLWriter(cmXMLWriter *this,ostream *output,size_t level)

{
  this->Output = output;
  (this->Elements).c.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Elements).c.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Elements).c.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->IndentationElement)._M_dataplus._M_p = (pointer)&(this->IndentationElement).field_2;
  std::__cxx11::string::_M_construct((ulong)&this->IndentationElement,'\x01');
  this->Level = level;
  this->Indent = 0;
  *(undefined4 *)((long)&this->Indent + 7) = 0;
  return;
}

Assistant:

cmXMLWriter::cmXMLWriter(std::ostream& output, std::size_t level)
  : Output(output)
  , IndentationElement(1, '\t')
  , Level(level)
  , Indent(0)
  , ElementOpen(false)
  , BreakAttrib(false)
  , IsContent(false)
{
}